

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::ProcessBailOutInfo(BackwardPass *this,Instr *instr,BailOutInfo *bailOutInfo)

{
  undefined1 *puVar1;
  Type TVar2;
  Type pJVar3;
  InlineeFrameInfo *pIVar4;
  ArgList *pAVar5;
  Type pIVar6;
  code *pcVar7;
  NodeBase *pNVar8;
  bool bVar9;
  BOOLEAN BVar10;
  uint32 offset;
  uint32 uVar11;
  BOOL BVar12;
  uint uVar13;
  RegSlot RVar14;
  undefined4 *puVar15;
  BVSparse<Memory::JitArenaAllocator> *pBVar16;
  Instr *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar17;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  Type *pTVar18;
  Instr *pIVar19;
  Type *pTVar20;
  StackSym *pSVar21;
  ulong uVar22;
  Type_conflict pBVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  undefined1 local_80 [8];
  Iterator __iter;
  anon_class_8_1_dda845c3 iterator;
  
  __iter.current = (NodeBase *)this->currentBlock;
  bVar9 = DoCaptureByteCodeUpwardExposedUsed(this);
  if ((((bVar9) && (this->currentPrePassLoop == (Loop *)0x0)) &&
      (bailOutInfo->bailOutFunc->topFunc->hasInstrNumber == false)) &&
     (bailOutInfo->bailOutFunc->byteCodeRegisterUses != (ByteCodeRegisterUses *)0x0)) {
    uVar28 = bailOutInfo->bailOutOffset;
    if (uVar28 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa77,"(offset != Js::Constants::NoByteCodeOffset)",
                         "offset != Js::Constants::NoByteCodeOffset");
      if (!bVar9) goto LAB_003dfcee;
      *puVar15 = 0;
    }
    pBVar16 = Func::GetByteCodeOffsetUses(bailOutInfo->bailOutFunc,uVar28);
    if (pBVar16 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (instr->m_kind == InstrKindBranch) {
        pIVar19 = instr[1].m_next;
        offset = IR::Instr::GetByteCodeOffset(pIVar19);
        uVar11 = IR::Instr::GetByteCodeOffset(instr);
        if ((offset == uVar11) && ((Opnd *)__iter.current != pIVar19[1].m_dst)) {
          if ((pIVar19[1].m_dst[1].m_valueType.field_0.bits &
              (String|Boolean|Number|Float|IntCanBeUntagged)) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xa8e,
                               "(target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource)"
                               ,
                               "target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource"
                              );
            if (!bVar9) goto LAB_003dfcee;
            *puVar15 = 0;
          }
          this_00 = IR::Instr::GetNextByteCodeInstr(pIVar19);
          offset = IR::Instr::GetByteCodeOffset(this_00);
        }
        pBVar17 = Func::GetByteCodeOffsetUses(pIVar19->m_func,offset);
        if (pBVar17 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        }
        else {
          pBVar17 = BVSparse<Memory::JitArenaAllocator>::OrNew(pBVar16,pBVar17);
          pBVar16 = pBVar17;
        }
      }
      else {
        pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      if (pBVar16 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0xa99,"(trackingByteCodeUpwardExposedUsed)",
                           "trackingByteCodeUpwardExposedUsed");
        if (!bVar9) goto LAB_003dfcee;
        *puVar15 = 0;
      }
      VerifyByteCodeUpwardExposed
                (this,(BasicBlock *)__iter.current,bailOutInfo->bailOutFunc,pBVar16,instr,uVar28);
      if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (pBVar17->alloc,pBVar17);
      }
    }
  }
  if (bailOutInfo->bailOutInstr != instr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaa3,"(bailOutInfo->bailOutInstr == instr)",
                       "bailOutInfo->bailOutInstr == instr");
    if (!bVar9) goto LAB_003dfcee;
    *puVar15 = 0;
  }
  if ((bailOutInfo->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     ((BVar12 = Func::HasTry(this->func), BVar12 == 0 ||
      (bVar9 = Func::DoOptimizeTry(this->func), !bVar9)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaa8,
                       "(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()))"
                       ,
                       "bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry())"
                      );
    if (!bVar9) goto LAB_003dfcee;
    *puVar15 = 0;
  }
  if (this->currentPrePassLoop == (Loop *)0x0) {
    iterator.callback.this =
         (anon_class_8_1_8991fb9c_for_callback)
         BVSparse<Memory::JitArenaAllocator>::CopyNew
                   ((BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x35].next,
                    this->func->m_alloc);
    bailOutInfo->byteCodeUpwardExposedUsed =
         (BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this;
  }
  else {
    iterator.callback.this =
         (anon_class_8_1_8991fb9c_for_callback)
         BVSparse<Memory::JitArenaAllocator>::CopyNew
                   ((BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x35].next,this->tempAlloc
                   );
  }
  pBVar16 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3f1274);
  pJVar3 = this->tempAlloc;
  pBVar16->head = (Type_conflict)0x0;
  pBVar16->lastFoundIndex = (Type_conflict)0x0;
  pBVar16->alloc = pJVar3;
  pBVar16->lastUsedNodePrevNextField = (Type)pBVar16;
  if ((this->currentPrePassLoop == (Loop *)0x0) && (bailOutInfo->startCallCount != 0)) {
    uVar27 = 0;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar28 = 0;
    do {
      for (uVar13 = BailOutInfo::GetStartCallOutParamCount(bailOutInfo,uVar28); uVar13 != 0;
          uVar13 = uVar13 - 1) {
        pSVar21 = bailOutInfo->argOutSyms[uVar27];
        if (pSVar21 != (StackSym *)0x0) {
          StackSym::GetArgSlotNum(pSVar21);
          if (((pSVar21->field_0x1a & 0x10) != 0) &&
             (*(short *)&(pSVar21->super_Sym).field_0x16 == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar9) goto LAB_003dfcee;
            *puVar15 = 0;
          }
          if ((pSVar21->field_0x1a & 0x10) == 0) {
            BVSparse<Memory::JitArenaAllocator>::Set(pBVar16,(pSVar21->super_Sym).m_id);
          }
        }
        uVar27 = (ulong)((int)uVar27 + 1);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < bailOutInfo->startCallCount);
  }
  ProcessBailOutArgObj
            (this,bailOutInfo,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this);
  if (instr->m_opcode != BailOnException) {
    ProcessBailOutConstants
              (this,bailOutInfo,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
               pBVar16);
    ProcessBailOutCopyProps
              (this,bailOutInfo,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
               pBVar16);
  }
  this_01 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3f1274);
  pJVar3 = this->tempAlloc;
  this_01->head = (Type_conflict)0x0;
  this_01->lastFoundIndex = (Type_conflict)0x0;
  this_01->alloc = pJVar3;
  this_01->lastUsedNodePrevNextField = (Type)this_01;
  pBVar17 = this_01;
  if (bailOutInfo->liveVarSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bVar9 = Func::DoGlobOpt(this->func);
    if (bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xb29,"(!this->func->DoGlobOpt())","!this->func->DoGlobOpt()");
      if (!bVar9) goto LAB_003dfcee;
      *puVar15 = 0;
    }
  }
  else {
    do {
      pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)pBVar17->head;
      if (pBVar17 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003df361;
    } while (((Type *)&pBVar17->alloc)->word == 0);
    if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xad8,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar9) goto LAB_003dfcee;
      *puVar15 = 0;
    }
LAB_003df361:
    BVSparse<Memory::JitArenaAllocator>::Minus
              (this_01,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
               bailOutInfo->liveVarSyms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this_01,bailOutInfo->liveLosslessInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this_01,bailOutInfo->liveFloat64Syms);
    pBVar17 = this_01;
    do {
      pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)pBVar17->head;
      if (pBVar17 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003df3f4;
    } while (((Type *)&pBVar17->alloc)->word == 0);
    if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xade,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar9) goto LAB_003dfcee;
      *puVar15 = 0;
    }
LAB_003df3f4:
    bVar9 = Func::IsJitInDebugMode(this->func);
    if (bVar9) {
      if (this->func->m_nonTempLocalVars == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0xae5,"(this->func->m_nonTempLocalVars)",
                           "this->func->m_nonTempLocalVars");
        if (!bVar9) goto LAB_003dfcee;
        *puVar15 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::And
                (this_01,this->func->m_nonTempLocalVars,bailOutInfo->liveVarSyms);
      local_80 = (undefined1  [8])bailOutInfo->usedCapturedValues;
      __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)local_80;
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        if (__iter.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar9) goto LAB_003dfcee;
          *puVar15 = 0;
        }
        __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_80) break;
        pTVar18 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)local_80);
        uVar26 = *(uint *)&pTVar18->key->field_0x18;
        if ((uVar26 >> 0xd & 1) == 0) {
          if ((uVar26 & 1) == 0) {
            pIVar19 = (Instr *)0x0;
          }
          else {
            pIVar19 = (pTVar18->key->field_5).m_instrDef;
          }
          if (pIVar19->m_opcode != BytecodeArgOutCapture) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xaeb,
                               "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                               ,
                               "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                              );
            if (!bVar9) goto LAB_003dfcee;
            *puVar15 = 0;
          }
        }
        if ((pTVar18->key->field_0x19 & 0x20) != 0) {
          RVar14 = StackSym::GetByteCodeRegSlot(pTVar18->key);
          BVSparse<Memory::JitArenaAllocator>::Clear(this_01,RVar14);
        }
      }
      local_80 = (undefined1  [8])&bailOutInfo->usedCapturedValues->copyPropSyms;
      __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)local_80;
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        if (__iter.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar9) goto LAB_003dfcee;
          *puVar15 = 0;
        }
        __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_80) break;
        pTVar20 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)local_80);
        uVar26 = *(uint *)&pTVar20->key->field_0x18;
        if ((uVar26 >> 0xd & 1) == 0) {
          if ((uVar26 & 1) == 0) {
            pIVar19 = (Instr *)0x0;
          }
          else {
            pIVar19 = (pTVar20->key->field_5).m_instrDef;
          }
          if (pIVar19->m_opcode != BytecodeArgOutCapture) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xaf4,
                               "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                               ,
                               "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                              );
            if (!bVar9) goto LAB_003dfcee;
            *puVar15 = 0;
          }
        }
        if ((pTVar20->key->field_0x19 & 0x20) != 0) {
          RVar14 = StackSym::GetByteCodeRegSlot(pTVar20->key);
          BVSparse<Memory::JitArenaAllocator>::Clear(this_01,RVar14);
        }
      }
      pBVar17 = bailOutInfo->usedCapturedValues->argObjSyms;
      __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)0x0;
      if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                  (this_01,pBVar17);
      }
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                ((BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,this_01);
    }
    if (instr->m_opcode != BailOnException) {
      BVSparse<Memory::JitArenaAllocator>::And
                (this_01,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
                 bailOutInfo->liveLosslessInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,this_01);
      pBVar23 = this_01->head;
      if (pBVar23 != (Type_conflict)0x0) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar27 = (pBVar23->data).word;
          if (uVar27 != 0) {
            TVar2 = pBVar23->startIndex;
            uVar22 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar22);
              pSVar21 = SymTable::FindStackSym(this->func->m_symTable,(BVIndex)uVar22 + TVar2);
              if (pSVar21->m_type != TyVar) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0xb0b,"(stackSym->GetType() == TyVar)",
                                   "stackSym->GetType() == TyVar");
                if (!bVar9) goto LAB_003dfcee;
                *puVar15 = 0;
              }
              pSVar21 = StackSym::GetInt32EquivSym(pSVar21,(Func *)0x0);
              if (pSVar21 == (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0xb0d,"(int32StackSym)","int32StackSym");
                if (!bVar9) goto LAB_003dfcee;
                *puVar15 = 0;
              }
              uVar27 = uVar27 & ~(1L << (uVar22 & 0x3f));
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
                         (pSVar21->super_Sym).m_id);
              lVar24 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              uVar22 = (ulong)(-(uint)(uVar27 == 0) | (uint)lVar24);
            } while (uVar27 != 0);
          }
          pBVar23 = pBVar23->next;
        } while (pBVar23 != (Type)0x0);
      }
      BVSparse<Memory::JitArenaAllocator>::And
                (this_01,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
                 bailOutInfo->liveFloat64Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,this_01);
      pBVar23 = this_01->head;
      if (pBVar23 != (Type_conflict)0x0) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar27 = (pBVar23->data).word;
          if (uVar27 != 0) {
            TVar2 = pBVar23->startIndex;
            uVar22 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar22);
              pSVar21 = SymTable::FindStackSym(this->func->m_symTable,(BVIndex)uVar22 + TVar2);
              if (pSVar21->m_type != TyVar) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0xb18,"(stackSym->GetType() == TyVar)",
                                   "stackSym->GetType() == TyVar");
                if (!bVar9) goto LAB_003dfcee;
                *puVar15 = 0;
              }
              pSVar21 = StackSym::GetFloat64EquivSym(pSVar21,(Func *)0x0);
              if (pSVar21 == (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0xb1a,"(float64StackSym)","float64StackSym");
                if (!bVar9) goto LAB_003dfcee;
                *puVar15 = 0;
              }
              uVar27 = uVar27 & ~(1L << (uVar22 & 0x3f));
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this,
                         (pSVar21->super_Sym).m_id);
              pSVar21->field_0x1a = pSVar21->field_0x1a | 2;
              lVar24 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              uVar22 = (ulong)(-(uint)(uVar27 == 0) | (uint)lVar24);
            } while (uVar27 != 0);
          }
          pBVar23 = pBVar23->next;
        } while (pBVar23 != (Type)0x0);
      }
    }
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (this->tempAlloc,this_01);
  if ((((instr->m_opcode == BailOnNoProfile) && (bVar9 = Func::IsInlinee(instr->m_func), bVar9)) &&
      ((instr->m_func->field_0x240 & 2) != 0)) &&
     (pIVar4 = instr->m_func->frameInfo, pIVar4->isRecorded == true)) {
    pAVar5 = pIVar4->arguments;
    if (0 < (pAVar5->
            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
            count) {
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar24 = 0;
      lVar25 = 0;
      do {
        pIVar6 = (pAVar5->
                 super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).buffer;
        if (*(int *)((long)&pIVar6->type + lVar24) == 1) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentBlock->upwardExposedUses,
                     *(BVIndex *)(*(long *)((long)&pIVar6->field_1 + lVar24) + 0x10));
        }
        if (*(int *)((long)&pIVar6->type + lVar24) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                             ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                             "value.type != InlineeFrameInfoValueType_None");
          if (!bVar9) goto LAB_003dfcee;
          *puVar15 = 0;
        }
        lVar25 = lVar25 + 1;
        lVar24 = lVar24 + 0x18;
      } while (lVar25 < (pAVar5->
                        super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                        ).count);
    }
    if ((pIVar4->function).type == InlineeFrameInfoValueType_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                         ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                         "function.type != InlineeFrameInfoValueType_None");
      if (!bVar9) {
LAB_003dfcee:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar15 = 0;
    }
    if ((pIVar4->function).type == InlineeFrameInfoValueType_Sym) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->upwardExposedUses,
                 (((pIVar4->function).field_1.sym)->super_Sym).m_id);
    }
  }
  pNVar8 = __iter.current;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)__iter.current[5].next,
             (BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)pNVar8[5].next,pBVar16);
  if ((this->currentPrePassLoop == (Loop *)0x0) && (bailOutInfo->startCallCount != 0)) {
    uVar26 = 0;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar28 = 0;
    do {
      for (uVar13 = BailOutInfo::GetStartCallOutParamCount(bailOutInfo,uVar28); uVar13 != 0;
          uVar13 = uVar13 - 1) {
        pSVar21 = bailOutInfo->argOutSyms[uVar26];
        if (pSVar21 != (StackSym *)0x0) {
          StackSym::GetArgSlotNum(pSVar21);
          if (((pSVar21->field_0x1a & 0x10) != 0) &&
             (*(short *)&(pSVar21->super_Sym).field_0x16 == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar9) goto LAB_003dfcee;
            *puVar15 = 0;
          }
          if (((pSVar21->field_0x1a & 0x10) != 0) ||
             (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar16,(pSVar21->super_Sym).m_id),
             BVar10 != '\0')) {
            puVar1 = &bailOutInfo->argOutSyms[uVar26]->field_0x18;
            *(uint *)puVar1 = *(uint *)puVar1 | 0x1000000;
          }
        }
        uVar26 = uVar26 + 1;
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < bailOutInfo->startCallCount);
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (this->tempAlloc,pBVar16);
  if (this->currentPrePassLoop != (Loop *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,(BVSparse<Memory::JitArenaAllocator> *)iterator.callback.this);
  }
  return;
}

Assistant:

void
BackwardPass::ProcessBailOutInfo(IR::Instr * instr, BailOutInfo * bailOutInfo)
{
    /*
    When we optimize functions having try-catch, we install a bailout at the starting of the catch block, namely, BailOnException.
    We don't have flow edges from all the possible exception points in the try to the catch block. As a result, this bailout should
    not try to restore from the constant values or copy-prop syms or the type specialized syms, as these may not necessarily be/have
    the right values. For example,

        //constant values
        c =
        try
        {
            <exception>
            c = k (constant)
        }
        catch
        {
            BailOnException
            = c  <-- We need to restore c from the value outside the try.
        }

        //copy-prop syms
        c =
        try
        {
            b = a
            <exception>
            c = b
        }
        catch
        {
            BailOnException
            = c  <-- We really want to restore c from its original sym, and not from its copy-prop sym, a
        }

        //type specialized syms
        a =
        try
        {
            <exception>
            a++  <-- type specializes a
        }
        catch
        {
            BailOnException
            = a  <-- We need to restore a from its var version.
        }
    */
    BasicBlock * block = this->currentBlock;
    BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed = nullptr;

#if DBG
    if (DoCaptureByteCodeUpwardExposedUsed() &&
        !IsPrePass() &&
        bailOutInfo->bailOutFunc->HasByteCodeOffset() &&
        bailOutInfo->bailOutFunc->byteCodeRegisterUses)
    {
        uint32 offset = bailOutInfo->bailOutOffset;
        Assert(offset != Js::Constants::NoByteCodeOffset);
        BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed = bailOutInfo->bailOutFunc->GetByteCodeOffsetUses(offset);
        if (trackingByteCodeUpwardExposedUsed)
        {
            BVSparse<JitArenaAllocator>* tmpBv = nullptr;
            if (instr->IsBranchInstr())
            {
                IR::BranchInstr* branchInstr = instr->AsBranchInstr();
                IR::LabelInstr* target = branchInstr->GetTarget();
                uint32 targetOffset = target->GetByteCodeOffset();

                // If the instr's label has the same bytecode offset as the instr then move the targetOffset
                // to the next bytecode instr. This can happen when we have airlock blocks or compensation
                // code, but also for infinite loops. Don't do it for the latter.
                if (targetOffset == instr->GetByteCodeOffset() && block != target->GetBasicBlock())
                {
                    // This can happen if the target is a break or airlock block.
                    Assert(
                        target->GetBasicBlock()->isAirLockBlock ||
                        target->GetBasicBlock()->isAirLockCompensationBlock ||
                        target->GetBasicBlock()->isBreakBlock ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSink ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSource
                    );
                    targetOffset = target->GetNextByteCodeInstr()->GetByteCodeOffset();
                }
                BVSparse<JitArenaAllocator>* branchTargetUpwardExposed = target->m_func->GetByteCodeOffsetUses(targetOffset);
                if (branchTargetUpwardExposed)
                {
                    // The bailout should restore both the bailout destination and
                    // the branch target since we don't know where we'll end up.
                    trackingByteCodeUpwardExposedUsed = tmpBv = trackingByteCodeUpwardExposedUsed->OrNew(branchTargetUpwardExposed);
                }
            }
            Assert(trackingByteCodeUpwardExposedUsed);
            VerifyByteCodeUpwardExposed(block, bailOutInfo->bailOutFunc, trackingByteCodeUpwardExposedUsed, instr, offset);
            if (tmpBv)
            {
                JitAdelete(tmpBv->GetAllocator(), tmpBv);
            }
        }
    }
#endif

    Assert(bailOutInfo->bailOutInstr == instr);

    // The byteCodeUpwardExposedUsed should only be assigned once. The only case which would break this
    // assumption is when we are optimizing a function having try-catch. In that case, we need the
    // byteCodeUpwardExposedUsed analysis in the initial backward pass too.
    Assert(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()));

    // Make a copy of the byteCodeUpwardExposedUsed so we can remove the constants
    if (!this->IsPrePass())
    {
        // Create the BV of symbols that need to be restored in the BailOutRecord
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->func->m_alloc);
        bailOutInfo->byteCodeUpwardExposedUsed = byteCodeUpwardExposedUsed;
    }
    else
    {
        // Create a temporary byteCodeUpwardExposedUsed
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->tempAlloc);
    }

    // All the register-based argument syms need to be tracked. They are either:
    //      1. Referenced as constants in bailOutInfo->usedcapturedValues.constantValues
    //      2. Referenced using copy prop syms in bailOutInfo->usedcapturedValues.copyPropSyms
    //      3. Marked as m_isBailOutReferenced = true & added to upwardExposedUsed bit vector to ensure we do not dead store their defs.
    //      The third set of syms is represented by the bailoutReferencedArgSymsBv.
    BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint, uint, StackSym* sym) {
            if (!sym->IsArgSlotSym())
            {
                bailoutReferencedArgSymsBv->Set(sym->m_id);
            }
        });
    }

    // Process Argument object first, as they can be found on the stack and don't need to rely on copy prop
    this->ProcessBailOutArgObj(bailOutInfo, byteCodeUpwardExposedUsed);

    if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
    {
        this->ProcessBailOutConstants(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
        this->ProcessBailOutCopyProps(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
    }

    BVSparse<JitArenaAllocator> * tempBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);

    if (bailOutInfo->liveVarSyms)
    {
        // Prefer to restore from type-specialized versions of the sym, as that will reduce the need for potentially expensive
        // ToVars that can more easily be eliminated due to being dead stores.

#if DBG
        Assert(tempBv->IsEmpty());

        // Verify that all syms to restore are live in some fashion
        tempBv->Minus(byteCodeUpwardExposedUsed, bailOutInfo->liveVarSyms);
        tempBv->Minus(bailOutInfo->liveLosslessInt32Syms);
        tempBv->Minus(bailOutInfo->liveFloat64Syms);
        Assert(tempBv->IsEmpty());
#endif

        if (this->func->IsJitInDebugMode())
        {
            // Add to byteCodeUpwardExposedUsed the non-temp local vars used so far to restore during bail out.
            // The ones that are not used so far will get their values from bytecode when we continue after bail out in interpreter.
            Assert(this->func->m_nonTempLocalVars);
            tempBv->And(this->func->m_nonTempLocalVars, bailOutInfo->liveVarSyms);

            // Remove syms that are restored in other ways than byteCodeUpwardExposedUsed.
            FOREACH_SLIST_ENTRY(ConstantStackSymValue, value, &bailOutInfo->usedCapturedValues->constantValues)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            FOREACH_SLIST_ENTRY(CopyPropSyms, value, &bailOutInfo->usedCapturedValues->copyPropSyms)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            if (bailOutInfo->usedCapturedValues->argObjSyms)
            {
                tempBv->Minus(bailOutInfo->usedCapturedValues->argObjSyms);
            }

            byteCodeUpwardExposedUsed->Or(tempBv);
        }

        if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
        {
            // Int32
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveLosslessInt32Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * int32StackSym = stackSym->GetInt32EquivSym(nullptr);
                Assert(int32StackSym);
                byteCodeUpwardExposedUsed->Set(int32StackSym->m_id);
            }
            NEXT_BITSET_IN_SPARSEBV;

            // Float64
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveFloat64Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * float64StackSym = stackSym->GetFloat64EquivSym(nullptr);
                Assert(float64StackSym);
                byteCodeUpwardExposedUsed->Set(float64StackSym->m_id);

                // This float-specialized sym is going to be used to restore the corresponding byte-code register. Need to
                // ensure that the float value can be precisely coerced back to the original Var value by requiring that it is
                // specialized using BailOutNumberOnly.
                float64StackSym->m_requiresBailOnNotNumber = true;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        // Var
        // Any remaining syms to restore will be restored from their var versions
    }
    else
    {
        Assert(!this->func->DoGlobOpt());
    }

    JitAdelete(this->tempAlloc, tempBv);

    // BailOnNoProfile makes some edges dead. Upward exposed symbols info set after the BailOnProfile won't
    // flow through these edges, and, in turn, not through predecessor edges of the block containing the
    // BailOnNoProfile. This is specifically bad for an inlinee's argout syms as they are set as upward exposed
    // when we see the InlineeEnd, but may not look so to some blocks and may get overwritten.
    // Set the argout syms as upward exposed here.
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile && instr->m_func->IsInlinee() &&
        instr->m_func->m_hasInlineArgsOpt && instr->m_func->frameInfo->isRecorded)
    {
        instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
        {
            this->currentBlock->upwardExposedUses->Set(argSym->m_id);
        });
    }

    // Mark all the register that we need to restore as used (excluding constants)
    block->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
    block->upwardExposedUses->Or(bailoutReferencedArgSymsBv);

    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint index, uint, StackSym* sym) {
            if (sym->IsArgSlotSym() || bailoutReferencedArgSymsBv->Test(sym->m_id))
            {
                bailOutInfo->argOutSyms[index]->m_isBailOutReferenced = true;
            }
        });
    }

    JitAdelete(this->tempAlloc, bailoutReferencedArgSymsBv);

    if (this->IsPrePass())
    {
        JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
    }
}